

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hoardmanager.h
# Opt level: O2

void __thiscall
Hoard::
HoardManager<Hoard::AlignedSuperblockHeap<HL::SpinLockType,_262144UL,_Hoard::MmapSource>,_Hoard::GlobalHeap<262144UL,_Hoard::HoardSuperblockHeader,_8,_Hoard::MmapSource,_HL::SpinLockType>,_Hoard::HoardSuperblock<HL::SpinLockType,_262144,_Hoard::SmallHeap,_Hoard::HoardSuperblockHeader>,_8,_HL::SpinLockType,_Hoard::hoardThresholdFunctionClass,_Hoard::SmallHeap>
::HoardManager(HoardManager<Hoard::AlignedSuperblockHeap<HL::SpinLockType,_262144UL,_Hoard::MmapSource>,_Hoard::GlobalHeap<262144UL,_Hoard::HoardSuperblockHeader,_8,_Hoard::MmapSource,_HL::SpinLockType>,_Hoard::HoardSuperblock<HL::SpinLockType,_262144,_Hoard::SmallHeap,_Hoard::HoardSuperblockHeader>,_8,_HL::SpinLockType,_Hoard::hoardThresholdFunctionClass,_Hoard::SmallHeap>
               *this)

{
  Entry *pEVar1;
  SuperHeap *pSVar2;
  
  (this->
  super_BaseHoardManager<Hoard::HoardSuperblock<HL::SpinLockType,_262144,_Hoard::SmallHeap,_Hoard::HoardSuperblockHeader>_>
  )._magic = 0xedded00d;
  (this->
  super_BaseHoardManager<Hoard::HoardSuperblock<HL::SpinLockType,_262144,_Hoard::SmallHeap,_Hoard::HoardSuperblockHeader>_>
  )._vptr_BaseHoardManager = (_func_int **)&PTR_free_00115a58;
  this->_magic = 0xfeeddadd;
  this->_cachedSize = 0x10;
  this->_cachedRealSize = 0x10;
  this->_cachedSizeClass = 0;
  (this->_theLock)._mutex._M_base._M_i = false;
  (this->_stats)._item[0]._inUse = 0;
  (this->_stats)._item[0]._allocated = 0;
  (this->_stats)._item[1]._inUse = 0;
  (this->_stats)._item[1]._allocated = 0;
  (this->_stats)._item[2]._inUse = 0;
  (this->_stats)._item[2]._allocated = 0;
  (this->_stats)._item[3]._inUse = 0;
  (this->_stats)._item[3]._allocated = 0;
  (this->_stats)._item[4]._inUse = 0;
  (this->_stats)._item[4]._allocated = 0;
  (this->_stats)._item[5]._inUse = 0;
  (this->_stats)._item[5]._allocated = 0;
  (this->_stats)._item[6]._inUse = 0;
  (this->_stats)._item[6]._allocated = 0;
  (this->_stats)._item[7]._inUse = 0;
  (this->_stats)._item[7]._allocated = 0;
  (this->_stats)._item[8]._inUse = 0;
  (this->_stats)._item[8]._allocated = 0;
  (this->_stats)._item[9]._inUse = 0;
  (this->_stats)._item[9]._allocated = 0;
  (this->_stats)._item[10]._inUse = 0;
  (this->_stats)._item[10]._allocated = 0;
  (this->_stats)._item[0xb]._inUse = 0;
  (this->_stats)._item[0xb]._allocated = 0;
  (this->_stats)._item[0xc]._inUse = 0;
  (this->_stats)._item[0xc]._allocated = 0;
  (this->_stats)._item[0xd]._inUse = 0;
  (this->_stats)._item[0xd]._allocated = 0;
  (this->_stats)._item[0xe]._inUse = 0;
  (this->_stats)._item[0xe]._allocated = 0;
  Array<15UL,_Hoard::ManageOneSuperblock<Hoard::EmptyClass<Hoard::HoardSuperblock<HL::SpinLockType,_262144,_Hoard::SmallHeap,_Hoard::HoardSuperblockHeader>,_8>_>_>
  ::Array(&this->_otherBins);
  pSVar2 = GlobalHeap<262144UL,_Hoard::HoardSuperblockHeader,_8,_Hoard::MmapSource,_HL::SpinLockType>
           ::getHeap();
  (this->_ph)._theHeap = pSVar2;
  pEVar1 = &(this->_sourceHeap).
            super_AlignedSuperblockHeapHelper<HL::SpinLockType,_262144UL,_Hoard::MmapSource>.
            super_ConformantHeap<HL::LockedHeap<HL::SpinLockType,_Hoard::FixedRequestHeap<262144UL,_Hoard::SuperblockStore<262144UL,_HL::SpinLockType,_Hoard::MmapSource>_>_>_>
            .
            super_LockedHeap<HL::SpinLockType,_Hoard::FixedRequestHeap<262144UL,_Hoard::SuperblockStore<262144UL,_HL::SpinLockType,_Hoard::MmapSource>_>_>
            .
            super_FixedRequestHeap<262144UL,_Hoard::SuperblockStore<262144UL,_HL::SpinLockType,_Hoard::MmapSource>_>
            .super_SuperblockStore<262144UL,_HL::SpinLockType,_Hoard::MmapSource>._freeSuperblocks.
            head;
  (this->_sourceHeap).
  super_AlignedSuperblockHeapHelper<HL::SpinLockType,_262144UL,_Hoard::MmapSource>.
  super_ConformantHeap<HL::LockedHeap<HL::SpinLockType,_Hoard::FixedRequestHeap<262144UL,_Hoard::SuperblockStore<262144UL,_HL::SpinLockType,_Hoard::MmapSource>_>_>_>
  .
  super_LockedHeap<HL::SpinLockType,_Hoard::FixedRequestHeap<262144UL,_Hoard::SuperblockStore<262144UL,_HL::SpinLockType,_Hoard::MmapSource>_>_>
  .
  super_FixedRequestHeap<262144UL,_Hoard::SuperblockStore<262144UL,_HL::SpinLockType,_Hoard::MmapSource>_>
  .super_SuperblockStore<262144UL,_HL::SpinLockType,_Hoard::MmapSource>._freeSuperblocks.head.prev =
       pEVar1;
  *(Entry **)
   ((long)&(this->_sourceHeap).
           super_AlignedSuperblockHeapHelper<HL::SpinLockType,_262144UL,_Hoard::MmapSource>.
           super_ConformantHeap<HL::LockedHeap<HL::SpinLockType,_Hoard::FixedRequestHeap<262144UL,_Hoard::SuperblockStore<262144UL,_HL::SpinLockType,_Hoard::MmapSource>_>_>_>
           .
           super_LockedHeap<HL::SpinLockType,_Hoard::FixedRequestHeap<262144UL,_Hoard::SuperblockStore<262144UL,_HL::SpinLockType,_Hoard::MmapSource>_>_>
           .
           super_FixedRequestHeap<262144UL,_Hoard::SuperblockStore<262144UL,_HL::SpinLockType,_Hoard::MmapSource>_>
           .super_SuperblockStore<262144UL,_HL::SpinLockType,_Hoard::MmapSource>._freeSuperblocks +
   8) = pEVar1;
  (this->_sourceHeap).
  super_AlignedSuperblockHeapHelper<HL::SpinLockType,_262144UL,_Hoard::MmapSource>.
  super_ConformantHeap<HL::LockedHeap<HL::SpinLockType,_Hoard::FixedRequestHeap<262144UL,_Hoard::SuperblockStore<262144UL,_HL::SpinLockType,_Hoard::MmapSource>_>_>_>
  .
  super_LockedHeap<HL::SpinLockType,_Hoard::FixedRequestHeap<262144UL,_Hoard::SuperblockStore<262144UL,_HL::SpinLockType,_Hoard::MmapSource>_>_>
  .thelock._mutex._M_base._M_i = false;
  return;
}

Assistant:

HoardManager()
      : _magic (MAGIC_NUMBER),
	_cachedSize (binType::getClassSize(0)),
	_cachedRealSize (_cachedSize),
	_cachedSizeClass (0)
    {}